

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_op_tags.hpp
# Opt level: O0

string * __thiscall
viennamath::op_partial_deriv<double>::str_abi_cxx11_
          (string *__return_storage_ptr__,op_partial_deriv<double> *this)

{
  ostream *poVar1;
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [376];
  op_partial_deriv<double> *local_18;
  op_partial_deriv<double> *this_local;
  
  local_18 = this;
  this_local = (op_partial_deriv<double> *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"partial_deriv<");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->id_);
  std::operator<<(poVar1,">");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string str() const
      {
        std::stringstream ss;
        ss << "partial_deriv<" << id_ << ">";
        return ss.str();
      }